

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Gia_Man_t * Gia_ManSimPatGenMiter(Gia_Man_t *p,Vec_Wrd_t *vSims)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  word *pwVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  uVar6 = vSims->nSize / p->nObjs;
  p_00 = Gia_ManStart(p->nObjs + p->vCos->nSize);
  Gia_ManHashStart(p_00);
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      iVar7 = pVVar8->pArray[lVar12];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar11 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_007b7d2d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_007b7d2d;
      pGVar3[iVar7].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCis;
    } while (lVar12 < pVVar8->nSize);
  }
  if (0 < p->nObjs) {
    lVar12 = 8;
    lVar13 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar3 + lVar12 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar1 = *(uint *)((long)pGVar3 +
                         lVar12 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar2 = *(uint *)((long)pGVar3 +
                             lVar12 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_007b7d6b;
        iVar7 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar12) = iVar7;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar13 < p->nObjs);
  }
  if (0 < p->nObjs) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + lVar13;
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
        lVar10 = lVar13 * (int)uVar6;
        if ((lVar10 < 0) || (vSims->nSize <= lVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar5 = vSims->pArray;
        if (0 < (int)uVar6) {
          uVar11 = 0;
          do {
            if (*(long *)((long)pwVar5 + uVar11 * 8 + lVar12) != 0) goto LAB_007b7ccc;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        if ((int)pGVar3->Value < 0) {
LAB_007b7d6b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,pGVar3->Value);
LAB_007b7ccc:
        if (0 < (int)uVar6) {
          uVar11 = 0;
          do {
            if (*(long *)((long)pwVar5 + uVar11 * 8 + lVar12) != -1) goto LAB_007b7cfe;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        if ((int)pGVar3->Value < 0) goto LAB_007b7d6b;
        Gia_ManAppendCo(p_00,pGVar3->Value ^ 1);
      }
LAB_007b7cfe:
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + (long)(int)uVar6 * 8;
    } while (lVar13 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManSimPatGenMiter( Gia_Man_t * p, Vec_Wrd_t * vSims )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + Gia_ManCoNum(p) );
    Gia_ManHashStart( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( Abc_TtIsConst0(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 0) );
        if ( Abc_TtIsConst1(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 1) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}